

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O3

void launch_test_thread<short>(vector<std::thread,_std::allocator<std::thread>_> *test_threads)

{
  pointer ptVar1;
  vector<std::thread,_std::allocator<std::thread>_> *__range1;
  iterator __begin1;
  pointer ptVar2;
  iterator __end1;
  pointer ptVar3;
  
  if (launch_test_thread<short>(std::vector<std::thread,std::allocator<std::thread>>&)::max_threads
      == '\0') {
    launch_test_thread<short>();
  }
  ptVar3 = (test_threads->super__Vector_base<std::thread,_std::allocator<std::thread>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  ptVar2 = (test_threads->super__Vector_base<std::thread,_std::allocator<std::thread>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)ptVar3 - (long)ptVar2 >> 3 == (ulong)launch_test_thread<short>::max_threads) {
    if (ptVar2 != ptVar3) {
      do {
        std::thread::join();
        ptVar2 = ptVar2 + 1;
      } while (ptVar2 != ptVar3);
      ptVar2 = (test_threads->super__Vector_base<std::thread,_std::allocator<std::thread>_>)._M_impl
               .super__Vector_impl_data._M_start;
      ptVar3 = (test_threads->super__Vector_base<std::thread,_std::allocator<std::thread>_>)._M_impl
               .super__Vector_impl_data._M_finish;
    }
    ptVar1 = ptVar2;
    if (ptVar3 != ptVar2) {
      do {
        if ((ptVar1->_M_id)._M_thread != 0) {
          std::terminate();
        }
        ptVar1 = ptVar1 + 1;
      } while (ptVar1 != ptVar3);
      (test_threads->super__Vector_base<std::thread,_std::allocator<std::thread>_>)._M_impl.
      super__Vector_impl_data._M_finish = ptVar2;
    }
  }
  std::vector<std::thread,std::allocator<std::thread>>::emplace_back<void(&)()>
            ((vector<std::thread,std::allocator<std::thread>> *)test_threads,run_test<short>);
  return;
}

Assistant:

void launch_test_thread(std::vector<std::thread> &test_threads) {
    static uint8_t max_threads = get_max_threads();

    if (max_threads == test_threads.size()) {
        wait_for_threads(test_threads);
        test_threads.clear();
    }
    test_threads.emplace_back(run_test<_IntT>);
}